

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindow*,QRect>
               (QWindow *args,QRect args_1)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined1 uVar4;
  long in_FS_OFFSET;
  QRect args_1_00;
  GeometryChangeEvent event;
  undefined1 local_68 [16];
  undefined1 *local_58;
  Data *pDStack_50;
  QObject *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  QWindow *local_20 [2];
  long local_10;
  
  local_20[1] = args_1._8_8_;
  local_20[0] = args_1._0_8_;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    args_1_00.x2.m_i = (int)in_RCX;
    args_1_00.y2.m_i = (int)((ulong)in_RCX >> 0x20);
    args_1_00._0_8_ = local_20[1];
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindow*,QRect>
              ((QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery> *)args,local_20[0]
               ,args_1_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_00331b8a;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_50 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWindowSystemInterfacePrivate::GeometryChangeEvent::GeometryChangeEvent
            ((GeometryChangeEvent *)local_68,args,(QRect *)local_20);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)local_68);
LAB_00331b41:
    uVar4 = local_58._0_1_;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_68);
    if ((char)iVar3 != '\0') goto LAB_00331b41;
    uVar4 = 0;
  }
  local_68._0_8_ = &PTR__GeometryChangeEvent_007e9ce0;
  if (pDStack_50 != (Data *)0x0) {
    LOCK();
    (pDStack_50->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDStack_50->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pDStack_50->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
       (pDStack_50 != (Data *)0x0)) {
      operator_delete(pDStack_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)uVar4;
  }
LAB_00331b8a:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}